

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_conversion.cpp
# Opt level: O0

bool __thiscall
crnlib::texture_conversion::convert_stats::print
          (convert_stats *this,bool psnr_metrics,bool mip_stats,bool grayscale_sampling,
          char *pCSVStatsFile)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  pixel_format pVar6;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  mipmapped_texture *this_00;
  float local_344;
  ulong local_340;
  float local_2d8;
  float local_2a0;
  float local_274;
  undefined4 uStack_260;
  float bitrate;
  uint64 effective_output_size;
  dynamic_string filename;
  FILE *pFile;
  undefined1 local_238 [7];
  bool bCSVStatsFileExists;
  error_metrics luma_error;
  error_metrics rgb_error;
  image_u8 grayscale_b_1;
  image_u8 grayscale_a_1;
  image_u8 *pB_1;
  image_u8 *pA_1;
  image_u8 b_1;
  image_u8 a_1;
  image_u8 grayscale_b;
  image_u8 grayscale_a;
  image_u8 *pB;
  image_u8 *pA;
  undefined1 local_98 [8];
  image_u8 b;
  image_u8 a;
  uint level;
  uint face;
  uint num_levels;
  uint num_faces;
  char *pCSVStatsFile_local;
  bool grayscale_sampling_local;
  bool mip_stats_local;
  bool psnr_metrics_local;
  convert_stats *this_local;
  
  if (this->m_pInput_tex == (mipmapped_texture *)0x0) {
    return false;
  }
  uVar2 = mipmapped_texture::get_width(this->m_pInput_tex);
  uVar3 = mipmapped_texture::get_height(this->m_pInput_tex);
  uVar4 = mipmapped_texture::get_num_levels(this->m_pInput_tex);
  uVar5 = mipmapped_texture::get_num_faces(this->m_pInput_tex);
  pVar6 = mipmapped_texture::get_format(this->m_pInput_tex);
  pcVar8 = pixel_format_helpers::get_pixel_format_string(pVar6);
  console::info("Input texture: %ux%u, Levels: %u, Faces: %u, Format: %s",(ulong)uVar2,(ulong)uVar3,
                (ulong)uVar4,(ulong)uVar5,pcVar8);
  local_274 = (float)this->m_input_file_size;
  console::info("Input pixels: %u, Input file size: %u, Input bits/pixel: %1.3f",
                (double)((local_274 * 8.0) / (float)this->m_total_input_pixels),
                (ulong)this->m_total_input_pixels,this->m_input_file_size & 0xffffffff);
  this_00 = &this->m_output_tex;
  uVar2 = mipmapped_texture::get_width(this_00);
  uVar3 = mipmapped_texture::get_height(this_00);
  uVar4 = mipmapped_texture::get_num_levels(this_00);
  uVar5 = mipmapped_texture::get_num_faces(this_00);
  pVar6 = mipmapped_texture::get_format(this_00);
  pixel_format_helpers::get_pixel_format_string(pVar6);
  console::info("Output texture: %ux%u, Levels: %u, Faces: %u, Format: %s",(ulong)uVar2,(ulong)uVar3
                ,(ulong)uVar4,(ulong)uVar5);
  local_2a0 = (float)this->m_output_file_size;
  console::info("Output pixels: %u, Output file size: %u, Output bits/pixel: %1.3f",
                (double)((local_2a0 * 8.0) / (float)this->m_total_output_pixels),
                (ulong)this->m_total_output_pixels,this->m_output_file_size & 0xffffffff);
  if (this->m_output_comp_file_size != 0) {
    local_2d8 = (float)this->m_output_comp_file_size;
    console::info("LZMA compressed output file size: %u bytes, %1.3f bits/pixel",
                  (double)((local_2d8 * 8.0) / (float)this->m_total_output_pixels),
                  this->m_output_comp_file_size & 0xffffffff);
  }
  if (psnr_metrics) {
    uVar2 = mipmapped_texture::get_width(this->m_pInput_tex);
    uVar3 = mipmapped_texture::get_width(&this->m_output_tex);
    if (uVar2 == uVar3) {
      uVar2 = mipmapped_texture::get_height(this->m_pInput_tex);
      uVar3 = mipmapped_texture::get_height(&this->m_output_tex);
      if (uVar2 == uVar3) {
        uVar2 = mipmapped_texture::get_num_faces(this->m_pInput_tex);
        uVar3 = mipmapped_texture::get_num_faces(&this->m_output_tex);
        if (uVar2 == uVar3) {
          uVar2 = mipmapped_texture::get_num_faces(this->m_pInput_tex);
          uVar3 = mipmapped_texture::get_num_faces(&this->m_output_tex);
          uVar7 = math::minimum<unsigned_int>(uVar2,uVar3);
          uVar2 = mipmapped_texture::get_num_levels(this->m_pInput_tex);
          uVar3 = mipmapped_texture::get_num_levels(&this->m_output_tex);
          level = math::minimum<unsigned_int>(uVar2,uVar3);
          if (!mip_stats) {
            level = 1;
          }
          for (a.m_pixel_buf.m_capacity = 0; a.m_pixel_buf.m_capacity < uVar7;
              a.m_pixel_buf.m_capacity = a.m_pixel_buf.m_capacity + 1) {
            for (a.m_pixel_buf.m_size = 0; a.m_pixel_buf.m_size < level;
                a.m_pixel_buf.m_size = a.m_pixel_buf.m_size + 1) {
              image<crnlib::color_quad<unsigned_char,_int>_>::image
                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)&b.m_pixel_buf.m_size);
              image<crnlib::color_quad<unsigned_char,_int>_>::image
                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)local_98);
              pB = mipmapped_texture::get_level_image
                             (this->m_pInput_tex,a.m_pixel_buf.m_capacity,a.m_pixel_buf.m_size,
                              (image_u8 *)&b.m_pixel_buf.m_size,3);
              grayscale_a.m_pixel_buf._8_8_ =
                   mipmapped_texture::get_level_image
                             (&this->m_output_tex,a.m_pixel_buf.m_capacity,a.m_pixel_buf.m_size,
                              (image_u8 *)local_98,3);
              if ((pB != (image_u8 *)0x0) &&
                 ((image_u8 *)grayscale_a.m_pixel_buf._8_8_ != (image_u8 *)0x0)) {
                image<crnlib::color_quad<unsigned_char,_int>_>::image
                          ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                           &grayscale_b.m_pixel_buf.m_size);
                image<crnlib::color_quad<unsigned_char,_int>_>::image
                          ((image<crnlib::color_quad<unsigned_char,_int>_> *)&a_1.m_pixel_buf.m_size
                          );
                if (grayscale_sampling) {
                  image<crnlib::color_quad<unsigned_char,_int>_>::operator=
                            ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                             &grayscale_b.m_pixel_buf.m_size,pB);
                  image<crnlib::color_quad<unsigned_char,_int>_>::convert_to_grayscale
                            ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                             &grayscale_b.m_pixel_buf.m_size);
                  pB = (image_u8 *)&grayscale_b.m_pixel_buf.m_size;
                  image<crnlib::color_quad<unsigned_char,_int>_>::operator=
                            ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                             &a_1.m_pixel_buf.m_size,
                             (image<crnlib::color_quad<unsigned_char,_int>_> *)
                             grayscale_a.m_pixel_buf._8_8_);
                  image<crnlib::color_quad<unsigned_char,_int>_>::convert_to_grayscale
                            ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                             &a_1.m_pixel_buf.m_size);
                  grayscale_a.m_pixel_buf._8_8_ = &a_1.m_pixel_buf.m_size;
                }
                console::info("Face %u Mipmap level %u statistics:",(ulong)a.m_pixel_buf.m_capacity,
                              (ulong)a.m_pixel_buf.m_size);
                image_utils::print_image_metrics(pB,(image_u8 *)grayscale_a.m_pixel_buf._8_8_);
                bVar1 = image<crnlib::color_quad<unsigned_char,_int>_>::has_rgb(pB);
                if ((bVar1) ||
                   (bVar1 = image<crnlib::color_quad<unsigned_char,_int>_>::has_rgb
                                      ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                                       grayscale_a.m_pixel_buf._8_8_), bVar1)) {
                  image_utils::print_ssim(pB,(image_u8 *)grayscale_a.m_pixel_buf._8_8_);
                }
                image<crnlib::color_quad<unsigned_char,_int>_>::~image
                          ((image<crnlib::color_quad<unsigned_char,_int>_> *)&a_1.m_pixel_buf.m_size
                          );
                image<crnlib::color_quad<unsigned_char,_int>_>::~image
                          ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                           &grayscale_b.m_pixel_buf.m_size);
              }
              image<crnlib::color_quad<unsigned_char,_int>_>::~image
                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)local_98);
              image<crnlib::color_quad<unsigned_char,_int>_>::~image
                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)&b.m_pixel_buf.m_size);
            }
          }
          if (pCSVStatsFile == (char *)0x0) {
            return true;
          }
          image<crnlib::color_quad<unsigned_char,_int>_>::image
                    ((image<crnlib::color_quad<unsigned_char,_int>_> *)&b_1.m_pixel_buf.m_size);
          image<crnlib::color_quad<unsigned_char,_int>_>::image
                    ((image<crnlib::color_quad<unsigned_char,_int>_> *)&pA_1);
          pB_1 = mipmapped_texture::get_level_image
                           (this->m_pInput_tex,0,0,(image_u8 *)&b_1.m_pixel_buf.m_size,3);
          grayscale_a_1.m_pixel_buf._8_8_ =
               mipmapped_texture::get_level_image(&this->m_output_tex,0,0,(image_u8 *)&pA_1,3);
          if ((pB_1 != (image_u8 *)0x0) &&
             ((image_u8 *)grayscale_a_1.m_pixel_buf._8_8_ != (image_u8 *)0x0)) {
            image<crnlib::color_quad<unsigned_char,_int>_>::image
                      ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                       &grayscale_b_1.m_pixel_buf.m_size);
            image<crnlib::color_quad<unsigned_char,_int>_>::image
                      ((image<crnlib::color_quad<unsigned_char,_int>_> *)&rgb_error.mPeakSNR);
            if (grayscale_sampling) {
              image<crnlib::color_quad<unsigned_char,_int>_>::operator=
                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                         &grayscale_b_1.m_pixel_buf.m_size,pB_1);
              image<crnlib::color_quad<unsigned_char,_int>_>::convert_to_grayscale
                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                         &grayscale_b_1.m_pixel_buf.m_size);
              pB_1 = (image_u8 *)&grayscale_b_1.m_pixel_buf.m_size;
              image<crnlib::color_quad<unsigned_char,_int>_>::operator=
                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)&rgb_error.mPeakSNR,
                         (image<crnlib::color_quad<unsigned_char,_int>_> *)
                         grayscale_a_1.m_pixel_buf._8_8_);
              image<crnlib::color_quad<unsigned_char,_int>_>::convert_to_grayscale
                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)&rgb_error.mPeakSNR);
              grayscale_a_1.m_pixel_buf._8_8_ = &rgb_error.mPeakSNR;
            }
            image_utils::error_metrics::error_metrics((error_metrics *)&luma_error.mPeakSNR);
            image_utils::error_metrics::error_metrics((error_metrics *)local_238);
            bVar1 = image_utils::error_metrics::compute
                              ((error_metrics *)&luma_error.mPeakSNR,pB_1,
                               (image_u8 *)grayscale_a_1.m_pixel_buf._8_8_,0,3,false);
            if ((bVar1) &&
               (bVar1 = image_utils::error_metrics::compute
                                  ((error_metrics *)local_238,pB_1,
                                   (image_u8 *)grayscale_a_1.m_pixel_buf._8_8_,0,0,true), bVar1)) {
              bVar1 = file_utils::does_file_exist(pCSVStatsFile);
              filename.m_pStr = (char *)fopen64(pCSVStatsFile,"a");
              if ((FILE *)filename.m_pStr == (FILE *)0x0) {
                console::warning("Unable to append to CSV stats file: %s\n",pCSVStatsFile);
              }
              else {
                if (!bVar1) {
                  fprintf((FILE *)filename.m_pStr,
                          "name,width,height,miplevels,rgb_rms,luma_rms,effective_output_size,effective_bitrate\n"
                         );
                }
                dynamic_string::dynamic_string((dynamic_string *)&effective_output_size);
                pcVar8 = dynamic_string::get_ptr(&this->m_src_filename);
                file_utils::split_path
                          (pcVar8,(dynamic_string *)0x0,(dynamic_string *)0x0,
                           (dynamic_string *)&effective_output_size,(dynamic_string *)0x0);
                pcVar8 = filename.m_pStr;
                if (this->m_output_comp_file_size == 0) {
                  local_340 = this->m_output_file_size;
                }
                else {
                  local_340 = this->m_output_comp_file_size;
                }
                local_344 = (float)local_340;
                uVar7 = this->m_total_output_pixels;
                pcVar9 = dynamic_string::get_ptr((dynamic_string *)&effective_output_size);
                uVar2 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width
                                  ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                                   grayscale_a_1.m_pixel_buf._8_8_);
                uVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height
                                  ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                                   grayscale_a_1.m_pixel_buf._8_8_);
                uVar4 = mipmapped_texture::get_num_levels(&this->m_output_tex);
                uStack_260 = (undefined4)local_340;
                fprintf((FILE *)pcVar8,"%s,%u,%u,%u,%f,%f,%u,%f\n",rgb_error.mMeanSquared,
                        luma_error.mMeanSquared,(double)((local_344 * 8.0) / (float)uVar7),pcVar9,
                        (ulong)uVar2,(ulong)uVar3,(ulong)uVar4,uStack_260);
                fclose((FILE *)filename.m_pStr);
                dynamic_string::~dynamic_string((dynamic_string *)&effective_output_size);
              }
            }
            image<crnlib::color_quad<unsigned_char,_int>_>::~image
                      ((image<crnlib::color_quad<unsigned_char,_int>_> *)&rgb_error.mPeakSNR);
            image<crnlib::color_quad<unsigned_char,_int>_>::~image
                      ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                       &grayscale_b_1.m_pixel_buf.m_size);
          }
          image<crnlib::color_quad<unsigned_char,_int>_>::~image
                    ((image<crnlib::color_quad<unsigned_char,_int>_> *)&pA_1);
          image<crnlib::color_quad<unsigned_char,_int>_>::~image
                    ((image<crnlib::color_quad<unsigned_char,_int>_> *)&b_1.m_pixel_buf.m_size);
          return true;
        }
      }
    }
    console::warning(
                    "Unable to compute image statistics - input/output texture dimensions are different."
                    );
  }
  return true;
}

Assistant:

bool convert_stats::print(bool psnr_metrics, bool mip_stats, bool grayscale_sampling, const char* pCSVStatsFile) const
        {
            if (!m_pInput_tex)
            {
                return false;
            }

            console::info("Input texture: %ux%u, Levels: %u, Faces: %u, Format: %s",
                m_pInput_tex->get_width(),
                m_pInput_tex->get_height(),
                m_pInput_tex->get_num_levels(),
                m_pInput_tex->get_num_faces(),
                pixel_format_helpers::get_pixel_format_string(m_pInput_tex->get_format()));

            // Just casting the uint64's filesizes to uint32 here to work around gcc issues - it's not even possible to have files that large anyway.
            console::info("Input pixels: %u, Input file size: %u, Input bits/pixel: %1.3f",
                m_total_input_pixels, (uint32)m_input_file_size, (m_input_file_size * 8.0f) / m_total_input_pixels);

            console::info("Output texture: %ux%u, Levels: %u, Faces: %u, Format: %s",
                m_output_tex.get_width(),
                m_output_tex.get_height(),
                m_output_tex.get_num_levels(),
                m_output_tex.get_num_faces(),
                pixel_format_helpers::get_pixel_format_string(m_output_tex.get_format()));

            console::info("Output pixels: %u, Output file size: %u, Output bits/pixel: %1.3f",
                m_total_output_pixels, (uint32)m_output_file_size, (m_output_file_size * 8.0f) / m_total_output_pixels);

            if (m_output_comp_file_size)
            {
                console::info("LZMA compressed output file size: %u bytes, %1.3f bits/pixel",
                    (uint32)m_output_comp_file_size, (m_output_comp_file_size * 8.0f) / m_total_output_pixels);
            }
            if (psnr_metrics)
            {
                if ((m_pInput_tex->get_width() != m_output_tex.get_width()) || (m_pInput_tex->get_height() != m_output_tex.get_height()) || (m_pInput_tex->get_num_faces() != m_output_tex.get_num_faces()))
                {
                    console::warning("Unable to compute image statistics - input/output texture dimensions are different.");
                }
                else
                {
                    uint num_faces = math::minimum(m_pInput_tex->get_num_faces(), m_output_tex.get_num_faces());
                    uint num_levels = math::minimum(m_pInput_tex->get_num_levels(), m_output_tex.get_num_levels());

                    if (!mip_stats)
                    {
                        num_levels = 1;
                    }

                    for (uint face = 0; face < num_faces; face++)
                    {
                        for (uint level = 0; level < num_levels; level++)
                        {
                            image_u8 a, b;
                            image_u8* pA = m_pInput_tex->get_level_image(face, level, a);
                            image_u8* pB = m_output_tex.get_level_image(face, level, b);

                            if (pA && pB)
                            {
                                image_u8 grayscale_a, grayscale_b;
                                if (grayscale_sampling)
                                {
                                    grayscale_a = *pA;
                                    grayscale_a.convert_to_grayscale();
                                    pA = &grayscale_a;

                                    grayscale_b = *pB;
                                    grayscale_b.convert_to_grayscale();
                                    pB = &grayscale_b;
                                }

                                console::info("Face %u Mipmap level %u statistics:", face, level);
                                image_utils::print_image_metrics(*pA, *pB);

                                if ((pA->has_rgb()) || (pB->has_rgb()))
                                {
                                    image_utils::print_ssim(*pA, *pB);
                                }
                            }
                        }
                    }

                    if (pCSVStatsFile)
                    {
                        // FIXME: This is kind of a hack, and should be combined with the code above.
                        image_u8 a, b;
                        image_u8* pA = m_pInput_tex->get_level_image(0, 0, a);
                        image_u8* pB = m_output_tex.get_level_image(0, 0, b);
                        if (pA && pB)
                        {
                            image_u8 grayscale_a, grayscale_b;
                            if (grayscale_sampling)
                            {
                                grayscale_a = *pA;
                                grayscale_a.convert_to_grayscale();
                                pA = &grayscale_a;

                                grayscale_b = *pB;
                                grayscale_b.convert_to_grayscale();
                                pB = &grayscale_b;
                            }

                            image_utils::error_metrics rgb_error;
                            image_utils::error_metrics luma_error;
                            if (rgb_error.compute(*pA, *pB, 0, 3, false) && luma_error.compute(*pA, *pB, 0, 0, true))
                            {
                                bool bCSVStatsFileExists = file_utils::does_file_exist(pCSVStatsFile);
                                FILE* pFile;
                                crn_fopen(&pFile, pCSVStatsFile, "a");
                                if (!pFile)
                                {
                                    console::warning("Unable to append to CSV stats file: %s\n", pCSVStatsFile);
                                }
                                else
                                {
                                    if (!bCSVStatsFileExists)
                                    {
                                        fprintf(pFile, "name,width,height,miplevels,rgb_rms,luma_rms,effective_output_size,effective_bitrate\n");
                                    }
                                    dynamic_string filename;
                                    file_utils::split_path(m_src_filename.get_ptr(), nullptr, nullptr, &filename, nullptr);

                                    uint64 effective_output_size = m_output_comp_file_size ? m_output_comp_file_size : m_output_file_size;
                                    float bitrate = (effective_output_size * 8.0f) / m_total_output_pixels;
                                    fprintf(pFile, "%s,%u,%u,%u,%f,%f,%u,%f\n",
                                        filename.get_ptr(),
                                        pB->get_width(), pB->get_height(), m_output_tex.get_num_levels(),
                                        rgb_error.mRootMeanSquared, luma_error.mRootMeanSquared,
                                        (uint32)effective_output_size, bitrate);
                                    fclose(pFile);
                                }
                            }
                        }
                    }
                }
            }

            return true;
        }